

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_redundancy_elimination.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::LocalRedundancyEliminationPass::EliminateRedundanciesInBB
          (LocalRedundancyEliminationPass *this,BasicBlock *block,ValueNumberTable *vnTable,
          map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *value_to_ids)

{
  char cVar1;
  Instruction *pIVar2;
  Instruction *pIVar3;
  code *pcVar4;
  bool modified;
  undefined1 local_79;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_78;
  _Any_data *local_70;
  undefined8 local_68;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  local_79 = 0;
  local_50._8_8_ = 0;
  local_50._M_unused._M_object = operator_new(0x20);
  *(LocalRedundancyEliminationPass **)local_50._M_unused._0_8_ = this;
  *(ValueNumberTable **)((long)local_50._M_unused._0_8_ + 8) = vnTable;
  *(undefined1 **)((long)local_50._M_unused._0_8_ + 0x10) = &local_79;
  *(map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    **)((long)local_50._M_unused._0_8_ + 0x18) = value_to_ids;
  local_38 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/local_redundancy_elimination.cpp:44:15)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/local_redundancy_elimination.cpp:44:15)>
             ::_M_manager;
  local_68 = 0;
  local_58 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:295:7)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:295:7)>
             ::_M_manager;
  pIVar2 = (block->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  local_70 = &local_50;
  if (pIVar2 != (Instruction *)0x0) {
    local_78._M_head_impl = pIVar2;
    std::
    _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/local_redundancy_elimination.cpp:44:15)>
    ::_M_invoke(&local_50,&local_78._M_head_impl);
  }
  pIVar2 = (block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  pcVar4 = std::
           _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:295:7)>
           ::_M_manager;
  if ((pIVar2 != (Instruction *)0x0) &&
     ((pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
    do {
      if (pIVar2 == (Instruction *)0x0) break;
      pIVar3 = (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      local_78._M_head_impl = pIVar2;
      if (local_60 == (code *)0x0) {
        std::__throw_bad_function_call();
      }
      if ((pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
        pIVar3 = (Instruction *)0x0;
      }
      cVar1 = (*local_58)(&local_70,&local_78);
      pIVar2 = pIVar3;
    } while (cVar1 != '\0');
    pcVar4 = local_60;
    if (local_60 == (code *)0x0) goto LAB_0023d5b5;
  }
  (*pcVar4)(&local_70,&local_70,3);
LAB_0023d5b5:
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,3);
  }
  return (bool)local_79;
}

Assistant:

bool LocalRedundancyEliminationPass::EliminateRedundanciesInBB(
    BasicBlock* block, const ValueNumberTable& vnTable,
    std::map<uint32_t, uint32_t>* value_to_ids) {
  bool modified = false;

  auto func = [this, &vnTable, &modified, value_to_ids](Instruction* inst) {
    if (inst->result_id() == 0) {
      return;
    }

    uint32_t value = vnTable.GetValueNumber(inst);

    if (value == 0) {
      return;
    }

    auto candidate = value_to_ids->insert({value, inst->result_id()});
    if (!candidate.second) {
      context()->KillNamesAndDecorates(inst);
      context()->ReplaceAllUsesWith(inst->result_id(), candidate.first->second);
      context()->KillInst(inst);
      modified = true;
    }
  };
  block->ForEachInst(func);
  return modified;
}